

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.cc
# Opt level: O2

void __thiscall S2Polyline::S2Polyline(S2Polyline *this,S2Polyline *other)

{
  int iVar1;
  
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polyline_00305cd0;
  this->s2debug_override_ = other->s2debug_override_;
  iVar1 = other->num_vertices_;
  other->num_vertices_ = 0;
  this->num_vertices_ = iVar1;
  (this->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl =
       (other->vertices_)._M_t.
       super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
       super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
       super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl;
  (other->vertices_)._M_t.
  super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
  super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl = (Vector3<double> *)0x0;
  return;
}

Assistant:

S2Polyline::S2Polyline(S2Polyline&& other)
  : s2debug_override_(other.s2debug_override_),
    num_vertices_(absl::exchange(other.num_vertices_, 0)),
    vertices_(std::move(other.vertices_)) {
}